

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O0

void twiddle(fft_data *vec,int N,int radix)

{
  double dVar1;
  double dVar2;
  double theta2;
  double theta;
  int KL;
  int K;
  int radix_local;
  int N_local;
  fft_data *vec_local;
  
  vec->re = 1.0;
  vec->im = 0.0;
  for (theta._4_4_ = 1; theta._4_4_ < N / radix; theta._4_4_ = theta._4_4_ + 1) {
    dVar1 = (6.283185307179586 / (double)N) * (double)theta._4_4_;
    dVar2 = cos(dVar1);
    vec[theta._4_4_].re = dVar2;
    dVar1 = sin(dVar1);
    vec[theta._4_4_].im = -dVar1;
  }
  return;
}

Assistant:

void twiddle(fft_data *vec,int N, int radix) {
	int K,KL;
	fft_type theta,theta2;
	theta = PI2/N;
	KL = N/radix;
	vec[0].re = 1.0;
	vec[0].im = 0.0;

	for (K = 1; K < KL;K++) {
		theta2 = theta * K;
		vec[K].re = cos(theta2);
		vec[K].im = -sin(theta2);
	}

}